

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O0

void __thiscall
Js::LoopEntryPointInfo::LoopEntryPointInfo
          (LoopEntryPointInfo *this,LoopHeader *loopHeader,JavascriptLibrary *library)

{
  JavascriptLibrary *library_local;
  LoopHeader *loopHeader_local;
  LoopEntryPointInfo *this_local;
  
  EntryPointInfo::EntryPointInfo
            (&this->super_EntryPointInfo,(JavascriptMethod)0x0,library,(ThreadContext *)0x0,true);
  (this->super_EntryPointInfo).super_ProxyEntryPointInfo.super_ExpirableObject.
  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_01de07f0;
  Memory::WriteBarrierPtr<Js::LoopHeader>::WriteBarrierPtr(&this->loopHeader,loopHeader);
  this->jittedLoopIterationsSinceLastBailout = 0;
  this->totalJittedLoopIterations = 0;
  this->used = false;
  return;
}

Assistant:

LoopEntryPointInfo(LoopHeader* loopHeader, Js::JavascriptLibrary* library) :
            EntryPointInfo(nullptr, library, /*threadContext*/ nullptr, /*isLoopBody*/ true),
            loopHeader(loopHeader),
            jittedLoopIterationsSinceLastBailout(0),
            totalJittedLoopIterations(0)
#ifdef BGJIT_STATS
            ,used(false)
#endif
        { }